

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:258:56)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:258:56)>_>
          *this,EnumDescriptor *descriptor)

{
  Nonnull<std::string_*> pbVar1;
  char *pcVar2;
  bool bVar3;
  int i;
  int index;
  Status status;
  AlphaNum local_88;
  AlphaNum local_58;
  
  bVar3 = compiler::java::CheckLargeEnum(descriptor);
  if (bVar3) {
    bVar3 = EnumDescriptor::is_closed(descriptor);
    if (bVar3) {
      pbVar1 = *(this->visitor).super_anon_class_8_1_a7dec128.error;
      pcVar2 = (descriptor->all_names_).payload_;
      local_58.piece_._M_len = (size_t)*(ushort *)(pcVar2 + 2);
      local_58.piece_._M_str = pcVar2 + ~local_58.piece_._M_len;
      local_88.piece_ =
           absl::lts_20250127::NullSafeStringView
                     (
                     " is a closed enum and can not be used with the large_enum feature.  Please migrate to an open enum first, which is a better fit for extremely large enums.\n"
                     );
      absl::lts_20250127::StrAppend(pbVar1,&local_58,&local_88);
    }
  }
  compiler::java::ValidateNestInFileClassFeature((java *)&local_88,descriptor);
  if (local_88.piece_._M_len != 1) {
    pbVar1 = *(this->visitor).super_anon_class_8_1_a7dec128.error;
    local_58.piece_ = absl::lts_20250127::Status::message((Status *)&local_88);
    absl::lts_20250127::StrAppend(pbVar1,&local_58);
  }
  absl::lts_20250127::Status::~Status((Status *)&local_88);
  for (index = 0; index < descriptor->value_count_; index = index + 1) {
    EnumDescriptor::value(descriptor,index);
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }